

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command)

{
  allocator<unsigned_char> local_16;
  value_type_conflict local_15;
  int local_14;
  MidiMessage *pMStack_10;
  int command_local;
  MidiMessage *this_local;
  
  local_14._0_1_ = (value_type_conflict)command;
  local_15 = (value_type_conflict)local_14;
  local_14 = command;
  pMStack_10 = this;
  std::allocator<unsigned_char>::allocator(&local_16);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1,&local_15,
             &local_16);
  std::allocator<unsigned_char>::~allocator(&local_16);
  return;
}

Assistant:

MidiMessage::MidiMessage(int command) : vector<uchar>(1, (uchar)command) {
	// do nothing
}